

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O1

void __thiscall
SuffixTree::GeneralizedSuffixTree::~GeneralizedSuffixTree(GeneralizedSuffixTree *this)

{
  pointer ppVar1;
  pointer ppNVar2;
  long lVar3;
  ulong uVar4;
  
  puts("Clearing tree...");
  if ((this->nodes != (char *)0x0) && (this->leaves != (char *)0x0)) {
    if (this->nodes_num != 0) {
      lVar3 = 0x28;
      uVar4 = 0;
      do {
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)(this->nodes + lVar3));
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x60;
      } while (uVar4 < this->nodes_num);
    }
    free(this->nodes);
    free(this->leaves);
  }
  puts("Tree was cleared successfully");
  ppVar1 = (this->answers).
           super__Vector_base<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar1 != (pointer)0x0) {
    operator_delete(ppVar1,(long)(this->answers).
                                 super__Vector_base<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar1);
  }
  ppNVar2 = (this->previous_suffixes).
            super__Vector_base<SuffixTree::Node_*,_std::allocator<SuffixTree::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar2 != (pointer)0x0) {
    operator_delete(ppNVar2,(long)(this->previous_suffixes).
                                  super__Vector_base<SuffixTree::Node_*,_std::allocator<SuffixTree::Node_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppNVar2
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->strings);
  return;
}

Assistant:

GeneralizedSuffixTree::~GeneralizedSuffixTree()
{
    printf ("Clearing tree...\n");
    if (nodes && leaves)
    {
        for (uint i = 0; i < nodes_num; ++i)
            reinterpret_cast<Node *> (nodes + i * sizeof (Node))->~Node();
        for (uint i = 0; i < leaves_num; ++i)
            reinterpret_cast<Leaf *> (leaves + i * sizeof (Leaf))->~Leaf();
        free (nodes);
        free (leaves);
    }
    printf ("Tree was cleared successfully\n");
}